

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

string * __thiscall lsh::vector::to_string_abi_cxx11_(string *__return_storage_ptr__,vector *this)

{
  uint uVar1;
  bool bVar2;
  uint i;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  uVar1 = this->size_;
  std::__cxx11::string::string((string *)&local_70,"Vector[",(allocator *)&local_50);
  for (i = 0; uVar1 != i; i = i + 1) {
    bVar2 = get(this,i);
    std::__cxx11::to_string(&local_50,(uint)bVar2);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator+(__return_storage_ptr__,&local_70,"]");
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string vector::to_string() const {
    unsigned int n = this->size_;

    std::string value = "Vector[";

    for (unsigned int i = 0; i < n; i++) {
      value += std::to_string(this->get(i));
    }

    return value + "]";
  }